

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

bool ctemplate::anon_unknown_14::PragmaMarker::IsValidAttribute
               (PragmaId pragma_id,char *name,size_t namelen)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  
  lVar5 = 0;
  bVar2 = true;
  do {
    while( true ) {
      bVar1 = bVar2;
      __s = *(char **)(&DAT_0014d2c0 + lVar5 * 8 + (ulong)pragma_id * 0x20);
      if (__s == (char *)0x0) {
        return false;
      }
      sVar4 = strlen(__s);
      if (sVar4 == namelen) break;
      lVar5 = 1;
      bVar2 = false;
      if (!bVar1) {
        return false;
      }
    }
    iVar3 = strncasecmp(__s,name,namelen);
    bVar6 = iVar3 == 0;
    if (bVar6) {
      return bVar6;
    }
    lVar5 = 1;
    bVar2 = false;
  } while (bVar1);
  return bVar6;
}

Assistant:

bool PragmaMarker::IsValidAttribute(PragmaId pragma_id, const char* name,
                                    size_t namelen) {
  const int kMaxAttributes = sizeof(g_pragmas[0].attribute_names) /
      sizeof(*g_pragmas[0].attribute_names);
  for (int i = 0; i < kMaxAttributes; ++i) {
    const char* attr_name = g_pragmas[pragma_id].attribute_names[i];
    if (attr_name == NULL)
      break;
    if ((strlen(attr_name) == namelen) &&
        (strncasecmp(attr_name, name, namelen) == 0))
      // We found the given name in our accepted attribute list.
      return true;
  }
  return false;  // We did not find the name.
}